

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O0

void pubkeyFieldTest(Pubkey *pubkey,PubkeyTestVector *test_vector)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Message *pMVar3;
  char *in_R9;
  string local_140;
  AssertHelper local_120;
  Message local_118;
  ByteData local_110;
  ByteData local_f8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  char *local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  string local_48;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  PubkeyTestVector *test_vector_local;
  Pubkey *pubkey_local;
  
  gtest_ar.message_.ptr_ = &test_vector->hex;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_48,pubkey);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_28,"test_vector.hex.c_str()","pubkey.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_79 = cfd::core::Pubkey::IsValid(pubkey);
  local_79 = !local_79;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_78,"test_vector.expect_invalid","!pubkey.IsValid()",
             &test_vector->expect_invalid,&local_79);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  gtest_ar_2.message_.ptr_._5_3_ = 0;
  gtest_ar_2.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar_2.message_.ptr_._4_4_ == 0) {
    local_a9 = cfd::core::Pubkey::IsCompress(pubkey);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_a8,"test_vector.expect_compress","pubkey.IsCompress()",
               &test_vector->expect_compress,&local_a9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pMVar3 = testing::Message::operator<<(&local_b8,(char (*) [4])" : ");
      local_c0 = (char *)std::__cxx11::string::c_str();
      pMVar3 = testing::Message::operator<<(pMVar3,&local_c0);
      pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [4])" : ");
      pMVar3 = testing::Message::operator<<(pMVar3,(bool)(test_vector->expect_compress & 1));
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
                 ,0x4b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,pMVar3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    cfd::core::Pubkey::GetData(&local_f8,pubkey);
    cfd::core::ByteData::ByteData(&local_110,&test_vector->hex);
    local_d9 = cfd::core::ByteData::Equals(&local_f8,&local_110);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_d8,&local_d9,(type *)0x0);
    cfd::core::ByteData::~ByteData(&local_110);
    cfd::core::ByteData::~ByteData(&local_f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_140,(internal *)local_d8,
                 (AssertionResult *)"pubkey.GetData().Equals(ByteData(test_vector.hex))","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
                 ,0x4e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  }
  return;
}

Assistant:

void pubkeyFieldTest(Pubkey pubkey, PubkeyTestVector test_vector) {
  EXPECT_STREQ(test_vector.hex.c_str(), pubkey.GetHex().c_str());
  ASSERT_EQ(test_vector.expect_invalid, !pubkey.IsValid());
  EXPECT_EQ(test_vector.expect_compress, pubkey.IsCompress())
      << " : " << test_vector.hex.c_str() << " : "
      << test_vector.expect_compress;
  EXPECT_TRUE(pubkey.GetData().Equals(ByteData(test_vector.hex)));
}